

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O2

int Ssw_SecWithPairs(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vIds1,Vec_Int_t *vIds2,
                    Ssw_Pars_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Aig_Man_t *p;
  abctime aVar3;
  char *format;
  int level;
  Aig_Man_t *pAVar4;
  
  pAVar4 = pAig1;
  aVar2 = Abc_Clock();
  if ((vIds1 == (Vec_Int_t *)0x0) || (vIds2 == (Vec_Int_t *)0x0)) {
    __assert_fail("vIds1 != NULL && vIds2 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswPairs.c"
                  ,0x181,
                  "int Ssw_SecWithPairs(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Ssw_Pars_t *)"
                 );
  }
  Abc_Print((int)pAVar4,"Performing specialized verification with node pairs.\n");
  p = Ssw_SignalCorrespondenceWithPairs(pAig1,pAig2,vIds1,vIds2,pPars);
  pAVar4 = p;
  iVar1 = Ssw_MiterStatus(p,1);
  level = (int)pAVar4;
  if (iVar1 == 0) {
    format = "Verification failed with a counter-example.  ";
  }
  else {
    if (iVar1 != 1) {
      Abc_Print(level,"Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
                (ulong)(uint)p->nRegs,(ulong)(uint)(pAig2->nRegs + pAig1->nRegs));
      goto LAB_0056529d;
    }
    format = "Verification successful.  ";
  }
  Abc_Print(level,format);
LAB_0056529d:
  Abc_Print(level,"%s =","Time");
  aVar3 = Abc_Clock();
  Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  Aig_ManStop(p);
  return iVar1;
}

Assistant:

int Ssw_SecWithPairs( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vIds1, Vec_Int_t * vIds2, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pAigRes;
    int RetValue;
    abctime clk = Abc_Clock();
    assert( vIds1 != NULL && vIds2 != NULL );
    // try the new AIGs
    Abc_Print( 1, "Performing specialized verification with node pairs.\n" );
    pAigRes = Ssw_SignalCorrespondenceWithPairs( pAig1, pAig2, vIds1, vIds2, pPars );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with a counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pAig1) + Aig_ManRegNum(pAig2) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigRes );
    return RetValue;
}